

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeClassPrototype(ExpressionContext *ctx,SynClassPrototype *syntax)

{
  Allocator *allocator;
  IntrusiveList<MatchData> generics;
  uint nameHash;
  TypeBase *node;
  TypeClass *this;
  char *in_R8;
  InplaceStr name;
  SynIdentifier local_c8;
  TypeClass *local_78;
  TypeClass *classType;
  IntrusiveList<MatchData> actualGenerics;
  TypeClass *originalDefinition;
  TypeBase *type;
  undefined1 auStack_40 [8];
  InplaceStr typeName;
  SynClassPrototype *syntax_local;
  ExpressionContext *ctx_local;
  
  typeName.end = (syntax->name->name).begin;
  name.end = in_R8;
  name.begin = (syntax->name->name).end;
  anon_unknown.dwarf_6f1cc::CheckTypeConflict
            ((anon_unknown_dwarf_6f1cc *)ctx,(ExpressionContext *)syntax,(SynBase *)typeName.end,
             name);
  _auStack_40 = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  nameHash = InplaceStr::hash((InplaceStr *)auStack_40);
  node = anon_unknown.dwarf_6f1cc::LookupTypeByName(ctx,nameHash);
  if (node == (TypeBase *)0x0) {
    IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&classType);
    this = ExpressionContext::get<TypeClass>(ctx);
    allocator = ctx->allocator;
    SynIdentifier::SynIdentifier(&local_c8,syntax->name,_auStack_40);
    generics.tail = actualGenerics.head;
    generics.head = (MatchData *)classType;
    TypeClass::TypeClass
              (this,allocator,&local_c8,&syntax->super_SynBase,ctx->scope,
               (TypeGenericClassProto *)0x0,generics,false,(TypeClass *)0x0);
    SynIdentifier::~SynIdentifier(&local_c8);
    local_78 = this;
    ExpressionContext::AddType(ctx,(TypeBase *)this);
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprClassPrototype>(ctx);
    ExprClassPrototype::ExprClassPrototype
              ((ExprClassPrototype *)ctx_local,&syntax->super_SynBase,ctx->typeVoid,local_78);
  }
  else {
    actualGenerics.tail = (MatchData *)getType<TypeClass>(node);
    if (((TypeClass *)actualGenerics.tail == (TypeClass *)0x0) ||
       ((((TypeClass *)actualGenerics.tail)->completed & 1U) != 0)) {
      anon_unknown.dwarf_6f1cc::Stop
                (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                 (ulong)(uint)((int)(syntax->name->name).end - (int)(syntax->name->name).begin),
                 (syntax->name->name).begin);
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprClassPrototype>(ctx);
    ExprClassPrototype::ExprClassPrototype
              ((ExprClassPrototype *)ctx_local,&syntax->super_SynBase,ctx->typeVoid,
               (TypeClass *)actualGenerics.tail);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeClassPrototype(ExpressionContext &ctx, SynClassPrototype *syntax)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	if(TypeBase *type = LookupTypeByName(ctx, typeName.hash()))
	{
		TypeClass *originalDefinition = getType<TypeClass>(type);

		if(!originalDefinition || originalDefinition->completed)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(syntax->name->name));

		return new (ctx.get<ExprClassPrototype>()) ExprClassPrototype(syntax, ctx.typeVoid, originalDefinition);
	}

	IntrusiveList<MatchData> actualGenerics;

	TypeClass *classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(syntax->name, typeName), syntax, ctx.scope, NULL, actualGenerics, false, NULL);

	ctx.AddType(classType);

	return new (ctx.get<ExprClassPrototype>()) ExprClassPrototype(syntax, ctx.typeVoid, classType);
}